

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmwrtimg.cpp
# Opt level: O0

void __thiscall
CVmImageWriter::begin_objs_block
          (CVmImageWriter *this,uint metaclass_idx,int large_objects,int trans)

{
  uint i;
  long lVar1;
  int in_ECX;
  int in_EDX;
  uint in_ESI;
  long in_RDI;
  uint flags;
  char buf [16];
  undefined4 in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  
  begin_block((CVmImageWriter *)CONCAT44(in_ESI,in_EDX),
              (char *)CONCAT44(in_ECX,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe4);
  i = (uint)(in_EDX != 0);
  if (in_ECX != 0) {
    i = i | 2;
  }
  lVar1 = CVmFile::get_pos((CVmFile *)CONCAT44(i,in_stack_ffffffffffffffd0));
  *(long *)(in_RDI + 0x38) = lVar1;
  ::oswp2(&stack0xffffffffffffffd8,0);
  ::oswp2(&stack0xffffffffffffffda,in_ESI);
  ::oswp2(&stack0xffffffffffffffdc,i);
  CVmFile::write_bytes
            ((CVmFile *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffd8,CONCAT44(i,in_stack_ffffffffffffffd0));
  return;
}

Assistant:

void CVmImageWriter::begin_objs_block(uint metaclass_idx, int large_objects,
                                      int trans)
{
    char buf[16];
    uint flags;

    /* begin the block */
    begin_block("OBJS", TRUE);

    /* prepare the flags */
    flags = 0;
    if (large_objects)
        flags |= 1;
    if (trans)
        flags |= 2;

    /* remember where the prefix goes so we can fix it up later */
    objs_prefix_ = fp_->get_pos();

    /* 
     *   write a placeholder object count, the metaclass dependency table
     *   index, and the OBJS flags 
     */
    oswp2(buf, 0);
    oswp2(buf + 2, metaclass_idx);
    oswp2(buf + 4, flags);

    /* write the prefix */
    fp_->write_bytes(buf, 6);
}